

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Match.cc
# Opt level: O3

uint64_t __thiscall flow::MatchRegEx::evaluate(MatchRegEx *this,FlowString *condition,Runner *env)

{
  long *plVar1;
  pointer ppVar2;
  bool bVar3;
  Result *result;
  unsigned_long *puVar4;
  pair<flow::util::RegExp,_unsigned_long> *one;
  pointer this_00;
  pointer __old_p;
  
  plVar1 = (long *)env->userdata_;
  if (plVar1 == (long *)0x0) {
    result = (Result *)0x0;
  }
  else {
    result = (Result *)*plVar1;
    if (result == (Result *)0x0) {
      result = (Result *)operator_new(0x20);
      (result->
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ).
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (result->
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ).
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      (result->
      super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ).
      super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (result->_M_begin)._M_current = (char *)0x0;
      *plVar1 = (long)result;
    }
  }
  this_00 = (this->map_).
            super__Vector_base<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->map_).
           super__Vector_base<std::pair<flow::util::RegExp,_unsigned_long>,_std::allocator<std::pair<flow::util::RegExp,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (this_00 == ppVar2) {
      puVar4 = &(this->super_Match).def_.elsePC;
LAB_0016aad1:
      return *puVar4;
    }
    bVar3 = util::RegExp::match(&this_00->first,condition,result);
    if (bVar3) {
      puVar4 = &this_00->second;
      goto LAB_0016aad1;
    }
    this_00 = this_00 + 1;
  } while( true );
}

Assistant:

uint64_t MatchRegEx::evaluate(const FlowString* condition, Runner* env) const {
  util::RegExpContext* cx = reinterpret_cast<util::RegExpContext*>(env->userdata());
  util::RegExp::Result* rs = cx ? cx->regexMatch() : nullptr;
  for (const std::pair<util::RegExp, uint64_t>& one : map_) {
    if (one.first.match(*condition, rs)) {
      return one.second;
    }
  }

  return def_.elsePC;  // no match found
}